

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::anon_unknown_0::BasicResourceUBO::RunIteration
          (BasicResourceUBO *this,uvec3 *param_1,uvec3 *num_groups,bool dispatch_indirect)

{
  CallLogWrapper *this_00;
  float *pfVar1;
  pointer pVVar2;
  undefined1 auVar3 [16];
  uvec3 *puVar4;
  bool bVar5;
  int i;
  GLuint GVar6;
  uint uVar7;
  long lVar8;
  ostream *poVar9;
  undefined7 in_register_00000009;
  long lVar10;
  uint uVar11;
  bool *compile_error;
  GLuint i_1;
  uint uVar12;
  bool bVar13;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  GLuint *pGVar20;
  int iVar21;
  float fVar22;
  uvec3 global_size;
  GLint p;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data;
  int local_208 [3];
  undefined4 local_1fc;
  GLuint *local_1f8;
  uvec3 *local_1f0;
  GLuint *local_1e8;
  string local_1e0;
  long local_1c0;
  undefined1 local_1b8 [128];
  ios_base local_138 [264];
  
  local_1fc = (undefined4)CONCAT71(in_register_00000009,dispatch_indirect);
  if (this->m_program != 0) {
    glu::CallLogWrapper::glDeleteProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
  }
  local_208[2] = 0;
  local_208[0] = 0;
  local_208[1] = 0;
  lVar8 = 0;
  do {
    local_208[lVar8] = num_groups->m_data[lVar8] * param_1->m_data[lVar8];
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1b8 + 0x10),"\nlayout(local_size_x = ",0x17);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)(local_1b8 + 0x10));
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,", local_size_y = ",0x11);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,", local_size_z = ",0x11);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,") in;\nconst uvec3 kGlobalSize = uvec3(",0x26);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,");\nlayout(std140) uniform InputBuffer {\n  vec4 data[",0x34);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,"];\n} g_in_buffer[12];\nlayout(std430) buffer OutputBuffer {\n  vec4 data0[",
             0x48);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"];\n  vec4 data1[",0x10);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"];\n  vec4 data2[",0x10);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"];\n  vec4 data3[",0x10);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"];\n  vec4 data4[",0x10);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"];\n  vec4 data5[",0x10);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"];\n  vec4 data6[",0x10);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"];\n  vec4 data7[",0x10);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"];\n  vec4 data8[",0x10);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"];\n  vec4 data9[",0x10);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"];\n  vec4 data10[",0x11);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"];\n  vec4 data11[",0x11);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,
             "];\n} g_out_buffer;\nvoid main() {\n  const uint global_index = gl_GlobalInvocationID.x +\n                            gl_GlobalInvocationID.y * kGlobalSize.x +\n                            gl_GlobalInvocationID.z * kGlobalSize.x * kGlobalSize.y;\n  g_out_buffer.data0[global_index] = g_in_buffer[0].data[global_index];\n  g_out_buffer.data1[global_index] = g_in_buffer[1].data[global_index];\n  g_out_buffer.data2[global_index] = g_in_buffer[2].data[global_index];\n  g_out_buffer.data3[global_index] = g_in_buffer[3].data[global_index];\n  g_out_buffer.data4[global_index] = g_in_buffer[4].data[global_index];\n  g_out_buffer.data5[global_index] = g_in_buffer[5].data[global_index];\n  g_out_buffer.data6[global_index] = g_in_buffer[6].data[global_index];\n  g_out_buffer.data7[global_index] = g_in_buffer[7].data[global_index];\n  g_out_buffer.data8[global_index] = g_in_buffer[8].data[global_index];\n  g_out_buffer.data9[global_index] = g_in_buffer[9].data[global_index];\n  g_out_buffer.data10[global_index] = g_in_buffer[10].data[global_index];\n  g_out_buffer.data11[global_index] = g_in_buffer[11].data[global_index];\n}"
             ,0x457);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
  GVar6 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,&local_1e0);
  this->m_program = GVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_1e0._M_dataplus._M_p._4_4_,(int)local_1e0._M_dataplus._M_p) !=
      &local_1e0.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_1e0._M_dataplus._M_p._4_4_,(int)local_1e0._M_dataplus._M_p),
                    local_1e0.field_2._M_allocated_capacity + 1);
    GVar6 = this->m_program;
  }
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,GVar6);
  bVar5 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,compile_error);
  bVar13 = false;
  if (bVar5) {
    uVar15 = 0;
    local_1f0 = param_1;
    do {
      sprintf(local_1b8,"InputBuffer[%u]",uVar15);
      GVar6 = glu::CallLogWrapper::glGetUniformBlockIndex(this_00,this->m_program,local_1b8);
      glu::CallLogWrapper::glUniformBlockBinding(this_00,this->m_program,GVar6,(GLuint)uVar15);
      local_1e0._M_dataplus._M_p._0_4_ = 0;
      glu::CallLogWrapper::glGetActiveUniformBlockiv
                (this_00,this->m_program,GVar6,0x90ec,(GLint *)&local_1e0);
      if ((int)local_1e0._M_dataplus._M_p == 0) {
        anon_unknown_0::Output("UNIFORM_BLOCK_REFERENCED_BY_COMPUTE_SHADER should be TRUE.\n");
        return false;
      }
      uVar14 = (GLuint)uVar15 + 1;
      uVar15 = (ulong)uVar14;
    } while (uVar14 != 0xc);
    uVar14 = num_groups->m_data[0] * local_1f0->m_data[0] * local_1f0->m_data[1] *
             num_groups->m_data[1] * local_1f0->m_data[2] * num_groups->m_data[2];
    pGVar20 = &this->m_storage_buffer;
    GVar6 = this->m_storage_buffer;
    if (GVar6 == 0) {
      glu::CallLogWrapper::glGenBuffers(this_00,1,pGVar20);
      GVar6 = *pGVar20;
    }
    uVar18 = 0;
    local_1f8 = pGVar20;
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,GVar6);
    uVar15 = (ulong)uVar14;
    local_1c0 = uVar15 * 0xc0;
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,local_1c0,(void *)0x0,0x88e8);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
    local_1e8 = this->m_uniform_buffer;
    if (this->m_uniform_buffer[0] == 0) {
      glu::CallLogWrapper::glGenBuffers(this_00,0xc,local_1e8);
    }
    lVar8 = 0;
    do {
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_1b8
                 ,uVar15,(allocator_type *)&local_1e0);
      if (uVar14 != 0) {
        lVar10 = 0;
        uVar7 = uVar18;
        do {
          fVar22 = (float)uVar7;
          pfVar1 = (float *)((long)(float *)local_1b8._0_8_ + lVar10);
          *pfVar1 = fVar22;
          pfVar1[1] = fVar22;
          pfVar1[2] = fVar22;
          pfVar1[3] = fVar22;
          lVar10 = lVar10 + 0x10;
          uVar7 = uVar7 + 1;
        } while (uVar15 << 4 != lVar10);
      }
      glu::CallLogWrapper::glBindBufferBase(this_00,0x8a11,(GLuint)lVar8,local_1e8[lVar8]);
      glu::CallLogWrapper::glBufferData(this_00,0x8a11,uVar15 << 4,(void *)local_1b8._0_8_,0x88e8);
      if ((pointer)local_1b8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ - local_1b8._0_8_);
      }
      lVar8 = lVar8 + 1;
      uVar18 = uVar18 + uVar14;
    } while (lVar8 != 0xc);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8a11,0);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
    pGVar20 = local_1f8;
    if ((char)local_1fc == '\0') {
      glu::CallLogWrapper::glDispatchCompute
                (this_00,num_groups->m_data[0],num_groups->m_data[1],num_groups->m_data[2]);
      pGVar20 = local_1f8;
    }
    else {
      GVar6 = this->m_dispatch_buffer;
      if (GVar6 == 0) {
        glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_dispatch_buffer);
        GVar6 = this->m_dispatch_buffer;
      }
      glu::CallLogWrapper::glBindBuffer(this_00,0x90ee,GVar6);
      glu::CallLogWrapper::glBufferData(this_00,0x90ee,0xc,num_groups,0x88e4);
      glu::CallLogWrapper::glDispatchComputeIndirect(this_00,0);
    }
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_1b8,
               (ulong)(uVar14 * 0xc),(allocator_type *)&local_1e0);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,*pGVar20);
    puVar4 = local_1f0;
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
    glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,local_1c0,(void *)local_1b8._0_8_);
    uVar14 = puVar4->m_data[2];
    uVar18 = num_groups->m_data[2];
    bVar13 = true;
    if (uVar18 * uVar14 != 0) {
      uVar7 = num_groups->m_data[0] * puVar4->m_data[0];
      uVar11 = num_groups->m_data[1] * puVar4->m_data[1];
      uVar15 = 0;
      uVar12 = 0;
      do {
        iVar16 = (int)uVar15;
        if (uVar11 != 0) {
          uVar19 = 0;
          do {
            iVar21 = (int)uVar15;
            if (uVar7 != 0) {
              uVar14 = 0;
              do {
                fVar22 = (float)uVar15;
                pVVar2 = (pointer)(local_1b8._0_8_ + uVar15 * 0x10);
                auVar3._4_4_ = -(uint)(pVVar2->m_data[1] == fVar22);
                auVar3._0_4_ = -(uint)(pVVar2->m_data[0] == fVar22);
                auVar3._8_4_ = -(uint)(pVVar2->m_data[2] == fVar22);
                auVar3._12_4_ = -(uint)(pVVar2->m_data[3] == fVar22);
                iVar17 = movmskps((int)uVar15 * 0x10,auVar3);
                if (iVar17 != 0xf) {
                  bVar13 = false;
                  anon_unknown_0::Output("Incorrect data at offset %d.\n");
                  goto LAB_009143b1;
                }
                uVar14 = uVar14 + 1;
                uVar15 = (ulong)((int)uVar15 + 0xc);
              } while (uVar14 < uVar7);
            }
            uVar19 = uVar19 + 1;
            uVar15 = (ulong)(iVar21 + uVar7 * 0xc);
            uVar14 = puVar4->m_data[2];
            uVar18 = num_groups->m_data[2];
          } while (uVar19 < uVar11);
        }
        uVar12 = uVar12 + 1;
        uVar15 = (ulong)(iVar16 + uVar7 * 0xc * uVar11);
      } while (uVar12 < uVar18 * uVar14);
    }
LAB_009143b1:
    if ((pointer)local_1b8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ - local_1b8._0_8_);
    }
  }
  return bVar13;
}

Assistant:

bool RunIteration(const uvec3& local_size, const uvec3& num_groups, bool dispatch_indirect)
	{
		if (m_program != 0)
			glDeleteProgram(m_program);
		m_program = CreateComputeProgram(GenSource(local_size, num_groups));
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return false;

		for (GLuint i = 0; i < 12; ++i)
		{
			char name[32];
			sprintf(name, "InputBuffer[%u]", i);
			const GLuint index = glGetUniformBlockIndex(m_program, name);
			glUniformBlockBinding(m_program, index, i);
			GLint p = 0;
			glGetActiveUniformBlockiv(m_program, index, GL_UNIFORM_BLOCK_REFERENCED_BY_COMPUTE_SHADER, &p);
			if (p == GL_FALSE)
			{
				Output("UNIFORM_BLOCK_REFERENCED_BY_COMPUTE_SHADER should be TRUE.\n");
				return false;
			}
		}

		const GLuint kBufferSize =
			local_size.x() * num_groups.x() * local_size.y() * num_groups.y() * local_size.z() * num_groups.z();

		if (m_storage_buffer == 0)
			glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(vec4) * kBufferSize * 12, NULL, GL_DYNAMIC_DRAW);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		if (m_uniform_buffer[0] == 0)
			glGenBuffers(12, m_uniform_buffer);
		for (GLuint i = 0; i < 12; ++i)
		{
			std::vector<vec4> data(kBufferSize);
			for (GLuint j = 0; j < kBufferSize; ++j)
			{
				data[j] = vec4(static_cast<float>(i * kBufferSize + j));
			}
			glBindBufferBase(GL_UNIFORM_BUFFER, i, m_uniform_buffer[i]);
			glBufferData(GL_UNIFORM_BUFFER, sizeof(vec4) * kBufferSize, &data[0], GL_DYNAMIC_DRAW);
		}
		glBindBuffer(GL_UNIFORM_BUFFER, 0);

		glUseProgram(m_program);
		if (dispatch_indirect)
		{
			if (m_dispatch_buffer == 0)
				glGenBuffers(1, &m_dispatch_buffer);
			glBindBuffer(GL_DISPATCH_INDIRECT_BUFFER, m_dispatch_buffer);
			glBufferData(GL_DISPATCH_INDIRECT_BUFFER, sizeof(num_groups), &num_groups[0], GL_STATIC_DRAW);
			glDispatchComputeIndirect(0);
		}
		else
		{
			glDispatchCompute(num_groups.x(), num_groups.y(), num_groups.z());
		}

		std::vector<vec4> data(kBufferSize * 12);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(vec4) * kBufferSize * 12, &data[0]);

		for (GLuint z = 0; z < local_size.z() * num_groups.z(); ++z)
		{
			for (GLuint y = 0; y < local_size.y() * num_groups.y(); ++y)
			{
				for (GLuint x = 0; x < local_size.x() * num_groups.x(); ++x)
				{
					const GLuint index = z * local_size.x() * num_groups.x() * local_size.y() * num_groups.y() +
										 y * local_size.x() * num_groups.x() + x;
					for (int i = 0; i < 1; ++i)
					{
						if (!IsEqual(data[index * 12 + i], vec4(static_cast<float>(index * 12 + i))))
						{
							Output("Incorrect data at offset %d.\n", index * 12 + i);
							return false;
						}
					}
				}
			}
		}
		return true;
	}